

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Memory * __thiscall
wasm::Module::addMemory
          (Module *this,unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *curr)

{
  Memory *pMVar1;
  allocator<char> local_41;
  string local_40;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_20;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *local_18;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *curr_local;
  Module *this_local;
  
  local_18 = curr;
  curr_local = (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)this;
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::unique_ptr(&local_20,curr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"addMemory",&local_41);
  pMVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>,std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>,wasm::Memory>
                     (&this->memories,&this->memoriesMap,&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_20);
  return pMVar1;
}

Assistant:

Memory* Module::addMemory(std::unique_ptr<Memory>&& curr) {
  return addModuleElement(memories, memoriesMap, std::move(curr), "addMemory");
}